

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O0

curl_ws_frame * curl_ws_meta(CURL *d)

{
  _Bool _Var1;
  void *pvVar2;
  websocket *ws;
  Curl_easy *data;
  CURL *d_local;
  
  if ((((d == (CURL *)0x0) || (*d != -0x3f212453)) ||
      (_Var1 = Curl_is_in_callback((Curl_easy *)d), !_Var1)) ||
     (((*(long *)((long)d + 0x20) == 0 || ((*(ulong *)((long)d + 0xa2c) >> 0x37 & 1) != 0)) ||
      (pvVar2 = Curl_conn_meta_get(*(connectdata **)((long)d + 0x20),"meta:proto:ws:conn"),
      pvVar2 == (void *)0x0)))) {
    d_local = (CURL *)0x0;
  }
  else {
    d_local = (CURL *)((long)pvVar2 + 0xe0);
  }
  return (curl_ws_frame *)d_local;
}

Assistant:

curl_ws_frame *curl_ws_meta(CURL *d)
{
  /* we only return something for websocket, called from within the callback
     when not using raw mode */
  struct Curl_easy *data = d;
  if(GOOD_EASY_HANDLE(data) && Curl_is_in_callback(data) &&
     data->conn && !data->set.ws_raw_mode) {
    struct websocket *ws;
    ws = Curl_conn_meta_get(data->conn, CURL_META_PROTO_WS_CONN);
    if(ws)
      return &ws->frame;

  }
  return NULL;
}